

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Npas4.test.cpp
# Opt level: O0

void __thiscall npas4_AllocPhysical_Test::~npas4_AllocPhysical_Test(npas4_AllocPhysical_Test *this)

{
  npas4_AllocPhysical_Test *this_local;
  
  ~npas4_AllocPhysical_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(npas4, AllocPhysical)
{
	const auto startTotal = npas4::GetRAMPhysicalTotal();
	EXPECT_GT(npas4::GetRAMSystemTotal(), int64_t(1024));
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemAvailable());
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemUsed());
	EXPECT_GT(npas4::GetRAMSystemAvailable(), npas4::GetRAMSystemUsed());

	const auto startUsedByCurrentProcess = npas4::GetRAMPhysicalUsedByCurrentProcess();
	EXPECT_GT(npas4::GetRAMSystemTotal(), npas4::GetRAMSystemUsedByCurrentProcess());
	EXPECT_GT(npas4::GetRAMSystemAvailable(), npas4::GetRAMSystemUsedByCurrentProcess());
	EXPECT_GT(npas4::GetRAMSystemUsed(), npas4::GetRAMSystemUsedByCurrentProcess());

	// This will always be true, but the compiler won't know that, preventing the
	// allocation from happening before we want it to.
	if(std::chrono::system_clock::now() == std::chrono::time_point<std::chrono::system_clock>())
	{
		const int64_t allocAmmount = 1052672;
		volatile uint8_t* megabyte = new uint8_t[allocAmmount];

		EXPECT_EQ(startTotal, npas4::GetRAMPhysicalTotal());
		EXPECT_NE(startUsedByCurrentProcess, npas4::GetRAMPhysicalUsedByCurrentProcess());

		EXPECT_LT(startUsedByCurrentProcess + allocAmmount, npas4::GetRAMPhysicalUsedByCurrentProcess())
			<< "We did an allocation, but are using less RAM. Start: " << startUsedByCurrentProcess << ", Alloc: " << allocAmmount;

		// Assume we are not swapping out to disk
		ASSERT_GT(npas4::GetRAMPhysicalUsedByCurrentProcess(), startUsedByCurrentProcess);

		const auto memoryDelta = npas4::GetRAMPhysicalUsedByCurrentProcess() - startUsedByCurrentProcess;
		EXPECT_NEAR(npas4::GetRAMPhysicalUsedByCurrentProcess() - startUsedByCurrentProcess, memoryDelta, 4096) << "Memory Delta: " << memoryDelta;
		delete[] megabyte;
	}
}